

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall
t_st_generator::st_getter(t_st_generator *this,ostream *out,string *cls,string *name)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)cls);
  std::operator+(&bStack_58,name,"");
  st_method(this,out,&local_38,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(out,"^ ");
  std::operator<<(poVar1,(string *)name);
  st_close_method(this,out);
  return;
}

Assistant:

void t_st_generator::st_getter(std::ostream& out, string cls, string name) {
  st_method(out, cls, name + "");
  out << "^ " << name;
  st_close_method(out);
}